

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

void do_channels(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *txt;
  char buf [4608];
  char acStack_1218 [4608];
  
  txt = acStack_1218;
  send_to_char("   channel     status\n\r",ch);
  send_to_char("---------------------\n\r",ch);
  send_to_char("auction        ",ch);
  pcVar2 = "Newbie channel is now ON\n\r";
  pcVar3 = "Newbie channel is now OFF\n\r";
  if ((ch->comm[0] & 8) == 0) {
    pcVar3 = "Newbie channel is now ON\n\r";
  }
  send_to_char(pcVar3 + 0x16,ch);
  send_to_char("Q/A            ",ch);
  pcVar3 = "Newbie channel is now OFF\n\r";
  if ((ch->comm[0] & 0x20) == 0) {
    pcVar3 = "Newbie channel is now ON\n\r";
  }
  send_to_char(pcVar3 + 0x16,ch);
  bVar4 = is_immortal(ch);
  if (bVar4) {
    send_to_char("god channel    ",ch);
    pcVar3 = "Newbie channel is now OFF\n\r";
    if ((ch->comm[0] & 4) == 0) {
      pcVar3 = "Newbie channel is now ON\n\r";
    }
    send_to_char(pcVar3 + 0x16,ch);
  }
  send_to_char("tells          ",ch);
  pcVar3 = "Newbie channel is now OFF\n\r";
  if ((ch->comm[0] & 2) == 0) {
    pcVar3 = "Newbie channel is now ON\n\r";
  }
  send_to_char(pcVar3 + 0x16,ch);
  send_to_char("quiet mode     ",ch);
  if ((ch->comm[0] & 1) == 0) {
    pcVar2 = "Newbie channel is now OFF\n\r";
  }
  send_to_char(pcVar2 + 0x16,ch);
  if ((ch->comm[0] & 0x1000000) != 0) {
    send_to_char("You are immune to snooping.\n\r",ch);
  }
  iVar1 = ch->lines;
  if (iVar1 == 0) {
    txt = "Scroll buffering is off.\n\r";
  }
  else {
    if (iVar1 == 0x14) goto LAB_00240298;
    sprintf(acStack_1218,"You display %d lines of scroll.\n\r",(ulong)(iVar1 + 2));
  }
  send_to_char(txt,ch);
LAB_00240298:
  if ((ch->comm[0] & 0x200000) != 0) {
    send_to_char("You cannot use tell.\n\r",ch);
  }
  if ((ch->comm[0] & 0x400000) != 0) {
    send_to_char("You cannot use channels.\n\r",ch);
  }
  if ((ch->comm[0] & 0x80000) != 0) {
    send_to_char("You cannot show emotions.\n\r",ch);
  }
  return;
}

Assistant:

void do_channels(CHAR_DATA *ch, char *argument)
{
	/* lists all channels and their status */
	send_to_char("   channel     status\n\r", ch);
	send_to_char("---------------------\n\r", ch);

	auto sendToChar = [](bool isSet, CHAR_DATA *ch) {
		auto txt = isSet ? "ON\n\r" : "OFF\n\r";
		send_to_char(txt, ch);
	}